

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O0

int fy_node_mapping_sort_cmp_default(fy_node_pair *fynp_a,fy_node_pair *fynp_b,void *arg)

{
  _Bool _Var1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  int local_68;
  _Bool local_62;
  _Bool local_61;
  undefined8 local_60;
  code *local_58;
  void *cmp_fn_arg;
  fy_node_scalar_compare_fn cmp_fn;
  fy_node_cmp_arg *cmp_arg;
  _Bool scalar_b;
  _Bool scalar_a;
  _Bool alias_b;
  _Bool alias_a;
  int idx_b;
  int idx_a;
  void *arg_local;
  fy_node_pair *fynp_b_local;
  fy_node_pair *fynp_a_local;
  
  if (arg == (void *)0x0) {
    local_58 = fy_node_scalar_cmp_default;
    local_60 = 0;
  }
  else {
    local_58 = *arg;
    local_60 = *(undefined8 *)((long)arg + 8);
  }
  local_61 = true;
  if (fynp_a->key != (fy_node *)0x0) {
    local_61 = fy_node_is_scalar(fynp_a->key);
  }
  local_62 = true;
  if (fynp_b->key != (fy_node *)0x0) {
    local_62 = fy_node_is_scalar(fynp_b->key);
  }
  if ((local_61 == false) || (local_62 == false)) {
    if ((local_61 == false) && (local_62 != false)) {
      fynp_a_local._4_4_ = -1;
    }
    else if ((local_61 == false) || (local_62 != false)) {
      if ((fynp_a->key->field_0x34 & 3) == (fynp_b->key->field_0x34 & 3)) {
        iVar3 = fy_node_mapping_get_pair_index(fynp_a->parent,fynp_a);
        iVar4 = fy_node_mapping_get_pair_index(fynp_b->parent,fynp_b);
        if (iVar4 < iVar3) {
          local_68 = 1;
        }
        else {
          local_68 = 0;
          if (iVar3 < iVar4) {
            local_68 = -1;
          }
        }
        fynp_a_local._4_4_ = local_68;
      }
      else {
        fynp_a_local._4_4_ = 1;
        if ((fynp_a->key->field_0x34 & 3) == 2) {
          fynp_a_local._4_4_ = -1;
        }
      }
    }
    else {
      fynp_a_local._4_4_ = 1;
    }
  }
  else {
    _Var1 = fy_node_is_alias(fynp_a->key);
    _Var2 = fy_node_is_alias(fynp_b->key);
    if ((!_Var1) || (_Var2)) {
      if ((_Var1) || (!_Var2)) {
        fynp_a_local._4_4_ = (*local_58)(fynp_a->key,fynp_b->key,local_60);
      }
      else {
        fynp_a_local._4_4_ = 1;
      }
    }
    else {
      fynp_a_local._4_4_ = -1;
    }
  }
  return fynp_a_local._4_4_;
}

Assistant:

static int fy_node_mapping_sort_cmp_default(const struct fy_node_pair *fynp_a,
                                            const struct fy_node_pair *fynp_b,
                                            void *arg) {
    int idx_a, idx_b;
    bool alias_a, alias_b, scalar_a, scalar_b;
    struct fy_node_cmp_arg *cmp_arg;
    fy_node_scalar_compare_fn cmp_fn;
    void *cmp_fn_arg;

    cmp_arg = arg;
    cmp_fn = cmp_arg ? cmp_arg->cmp_fn : fy_node_scalar_cmp_default;
    cmp_fn_arg = cmp_arg ? cmp_arg->arg : NULL;

    /* order is: maps first, followed by sequences, and last scalars sorted */
    scalar_a = !fynp_a->key || fy_node_is_scalar(fynp_a->key);
    scalar_b = !fynp_b->key || fy_node_is_scalar(fynp_b->key);

    /* scalar? perform comparison */
    if (scalar_a && scalar_b) {

        /* if both are aliases, sort skipping the '*' */
        alias_a = fy_node_is_alias(fynp_a->key);
        alias_b = fy_node_is_alias(fynp_b->key);

        /* aliases win */
        if (alias_a && !alias_b)
            return -1;

        if (!alias_a && alias_b)
            return 1;

        return cmp_fn(fynp_a->key, fynp_b->key, cmp_fn_arg);
    }

    /* b is scalar, a is not */
    if (!scalar_a && scalar_b)
        return -1;

    /* a is scalar, b is not */
    if (scalar_a && !scalar_b)
        return 1;

    /* different types, mappings win */
    if (fynp_a->key->type != fynp_b->key->type)
        return fynp_a->key->type == FYNT_MAPPING ? -1 : 1;

    /* ok, need to compare indices now */
    idx_a = fy_node_mapping_get_pair_index(fynp_a->parent, fynp_a);
    idx_b = fy_node_mapping_get_pair_index(fynp_b->parent, fynp_b);

    return idx_a > idx_b ? 1 : (idx_a < idx_b ? -1 : 0);
}